

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server.cpp
# Opt level: O1

void __thiscall echo_server::handle_error(echo_server *this,tcp_connection *conn)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  ostream *poVar4;
  size_t sVar5;
  ushort uVar6;
  pair<std::_Rb_tree_iterator<ranger::event::tcp_connection>,_std::_Rb_tree_iterator<ranger::event::tcp_connection>_>
  pVar7;
  allocator local_49;
  char *local_48;
  long local_40;
  char local_38 [16];
  
  uVar2 = ranger::event::tcp_connection::remote_endpoint();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"connection[",0xb);
  pcVar3 = inet_ntoa((in_addr)(in_addr_t)((ulong)uVar2 >> 0x20));
  std::__cxx11::string::string((string *)&local_48,pcVar3,&local_49);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_48,local_40);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  uVar6 = (ushort)((ulong)uVar2 >> 0x10);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)poVar4,(uint)(ushort)(uVar6 << 8 | uVar6 >> 8));
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"error[",6);
  iVar1 = ranger::event::tcp_connection::error_code();
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]: ",3);
  pcVar3 = (char *)ranger::event::tcp_connection::error_description();
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar3,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pVar7 = std::
          _Rb_tree<ranger::event::tcp_connection,_ranger::event::tcp_connection,_std::_Identity<ranger::event::tcp_connection>,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
          ::equal_range(&(this->m_conn_set)._M_t,conn);
  std::
  _Rb_tree<ranger::event::tcp_connection,_ranger::event::tcp_connection,_std::_Identity<ranger::event::tcp_connection>,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
  ::_M_erase_aux(&(this->m_conn_set)._M_t,(_Base_ptr)pVar7.first._M_node,
                 (_Base_ptr)pVar7.second._M_node);
  return;
}

Assistant:

void handle_error(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cerr << "connection[" << ep << "] " << "error[" << conn.error_code() << "]: " << conn.error_description() << std::endl;

		m_conn_set.erase(conn);
	}